

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshkdf.c
# Opt level: O0

void * kdf_sshkdf_new(void *provctx)

{
  int iVar1;
  char *in_RDI;
  KDF_SSHKDF *ctx;
  char *in_stack_fffffffffffffff8;
  undefined8 *puVar2;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    puVar2 = (undefined8 *)
             CRYPTO_zalloc((size_t)ctx,in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
    iVar1 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
    if (puVar2 == (undefined8 *)0x0) {
      ERR_new();
      ERR_set_debug((char *)ctx,iVar1,in_RDI);
      ERR_set_error(0x39,0xc0100,(char *)0x0);
    }
    *puVar2 = in_RDI;
  }
  return puVar2;
}

Assistant:

static void *kdf_sshkdf_new(void *provctx)
{
    KDF_SSHKDF *ctx;

    if (!ossl_prov_is_running())
        return NULL;

    if ((ctx = OPENSSL_zalloc(sizeof(*ctx))) == NULL)
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
    ctx->provctx = provctx;
    return ctx;
}